

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O1

void compact_vector_suite::run(void)

{
  test_int8_empty();
  test_int8_one();
  test_int8_many();
  test_int8_big();
  test_uint8_empty();
  test_uint8_one();
  test_uint8_many();
  test_uint8_big();
  test_int16_empty();
  test_uint16_empty();
  test_int32_empty();
  test_uint32_empty();
  test_int64_empty();
  test_uint64_empty();
  test_float32_empty();
  test_float64_empty();
  return;
}

Assistant:

void run()
{
    test_int8_empty();
    test_int8_one();
    test_int8_many();
    test_int8_big();
    test_uint8_empty();
    test_uint8_one();
    test_uint8_many();
    test_uint8_big();

    test_int16_empty();
    test_uint16_empty();

    test_int32_empty();
    test_uint32_empty();

    test_int64_empty();
    test_uint64_empty();

    test_float32_empty();
    test_float64_empty();
}